

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O1

void pztopology::TPZPyramid::AdjustTopDirections<double>
               (int ConstrainedFace,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  long lVar1;
  int i_1;
  int i;
  long lVar2;
  double dVar3;
  double dVar4;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> ar12;
  TPZManVector<double,_3> ar11;
  TPZManVector<double,_3> ar10;
  TPZManVector<double,_3> ar9;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> local_1b8;
  TPZManVector<double,_3> local_180;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_3> local_110;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  dVar3 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&local_180,3);
  TPZManVector<double,_3>::TPZManVector(&local_1b8,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_110,3);
  TPZManVector<double,_3>::TPZManVector(&local_148,3);
  lVar2 = 0;
  do {
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_180.super_TPZVec<double>.fStore[lVar2] = gradx->fElem[lVar2];
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_1b8.super_TPZVec<double>.fStore[lVar2] = gradx->fElem[lVar1 + lVar2];
    if ((lVar1 <= lVar2) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_68.super_TPZVec<double>.fStore[lVar2] =
         gradx->fElem[(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(double *)((long)local_180.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)local_180.super_TPZVec<double>.fStore + lVar2) / dVar3;
    *(double *)((long)local_1b8.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)local_1b8.super_TPZVec<double>.fStore + lVar2) / dVar3;
    dVar4 = *(double *)((long)local_68.super_TPZVec<double>.fStore + lVar2) / dVar3;
    *(double *)((long)local_68.super_TPZVec<double>.fStore + lVar2) = dVar4;
    *(double *)((long)local_a0.super_TPZVec<double>.fStore + lVar2) =
         dVar4 - (-*(double *)((long)local_180.super_TPZVec<double>.fStore + lVar2) -
                 *(double *)((long)local_1b8.super_TPZVec<double>.fStore + lVar2));
    *(double *)((long)local_d8.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)local_68.super_TPZVec<double>.fStore + lVar2) -
         (*(double *)((long)local_180.super_TPZVec<double>.fStore + lVar2) -
         *(double *)((long)local_1b8.super_TPZVec<double>.fStore + lVar2));
    *(double *)((long)local_110.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)local_68.super_TPZVec<double>.fStore + lVar2) -
         (*(double *)((long)local_180.super_TPZVec<double>.fStore + lVar2) +
         *(double *)((long)local_1b8.super_TPZVec<double>.fStore + lVar2));
    *(double *)((long)local_148.super_TPZVec<double>.fStore + lVar2) =
         *(double *)((long)local_68.super_TPZVec<double>.fStore + lVar2) -
         (*(double *)((long)local_1b8.super_TPZVec<double>.fStore + lVar2) -
         *(double *)((long)local_180.super_TPZVec<double>.fStore + lVar2));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  switch(ConstrainedFace) {
  case 1:
    lVar2 = 0;
    do {
      if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0xb + lVar2] = 0.0;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x12 + lVar2] = local_148.super_TPZVec<double>.fStore[lVar2] * 0.25;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x19 + lVar2] = local_1b8.super_TPZVec<double>.fStore[lVar2] * 0.5;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      directions->fElem
      [(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x20 + lVar2] =
           local_110.super_TPZVec<double>.fStore[lVar2] * 0.25;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case 2:
    lVar2 = 0;
    do {
      if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0xb + lVar2] = local_148.super_TPZVec<double>.fStore[lVar2] * 0.25;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x12 + lVar2] = 0.0;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x19 + lVar2] = local_a0.super_TPZVec<double>.fStore[lVar2] * 0.25;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      directions->fElem
      [(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x20 + lVar2] =
           local_180.super_TPZVec<double>.fStore[lVar2] * -0.5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case 3:
    lVar2 = 0;
    do {
      if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0xb + lVar2] = local_1b8.super_TPZVec<double>.fStore[lVar2] * -0.5;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x12 + lVar2] = local_a0.super_TPZVec<double>.fStore[lVar2] * 0.25;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x19 + lVar2] = 0.0;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      directions->fElem
      [(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x20 + lVar2] =
           local_d8.super_TPZVec<double>.fStore[lVar2] * 0.25;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case 4:
    lVar2 = 0;
    do {
      if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0xb + lVar2] = local_110.super_TPZVec<double>.fStore[lVar2] * 0.25;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x12 + lVar2] = local_180.super_TPZVec<double>.fStore[lVar2] * 0.5;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * 0x19 + lVar2] = local_d8.super_TPZVec<double>.fStore[lVar2] * 0.25;
      if ((lVar1 <= lVar2) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      directions->fElem
      [(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x20 + lVar2] = 0.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
               ,0x6d1);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_148);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_1b8);
  TPZManVector<double,_3>::~TPZManVector(&local_180);
  return;
}

Assistant:

void TPZPyramid::AdjustTopDirections(int ConstrainedFace,TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
#ifdef PZDEBUG
        if (directions.Cols() != 58 || ConstrainedFace < 1 || ConstrainedFace > 4) {
            DebugStop();
        }
#endif
        int vectors[] = {11,18,25,32};
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),ar9(3),ar10(3),ar11(3),ar12(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
        }
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
            ar9[i] = v3[i]-(-v1[i]-v2[i]);
            ar10[i] = v3[i]-(v1[i]-v2[i]);
            ar11[i] = v3[i]-(v1[i]+v2[i]);
            ar12[i] = v3[i]-(v2[i]-v1[i]);
        }

        switch (ConstrainedFace) {
            case 1:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = 0.;
                    directions(i,vectors[1]) = ar12[i]/4.;
                    directions(i,vectors[2]) = v2[i]/2.;
                    directions(i,vectors[3]) = ar11[i]/4.;
                }
                break;
            case 2:

                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = ar12[i]/4.;
                    directions(i,vectors[1]) = 0.;
                    directions(i,vectors[2]) = ar9[i]/4.;
                    directions(i,vectors[3]) = -v1[i]/2.;
                }
                    
                break;
            case 3:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = -v2[i]/2.;
                    directions(i,vectors[1]) = ar9[i]/4.;
                    directions(i,vectors[2]) = 0.;
                    directions(i,vectors[3]) = ar10[i]/4.;
                }
                break;
            case 4:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = ar11[i]/4.;
                    directions(i,vectors[1]) = v1[i]/2.;
                    directions(i,vectors[2]) = ar10[i]/4.;
                    directions(i,vectors[3]) = 0.;
                }
                break;
                
            default:
                DebugStop();
                break;
        }
    }